

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O3

int Spl_ManCountMarkedFanins(Gia_Man_t *p,int iObj,Vec_Bit_t *vMarks)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if ((iObj < 0) || (p->vMapping2->nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar2 = p->vMapping2->pArray;
  lVar4 = (long)pVVar2[(uint)iObj].nSize;
  if (lVar4 < 1) {
    iVar3 = 0;
  }
  else {
    lVar5 = 0;
    iVar3 = 0;
    do {
      uVar1 = pVVar2[(uint)iObj].pArray[lVar5];
      if (((int)uVar1 < 0) || (vMarks->nSize <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      iVar3 = iVar3 + (uint)(((uint)vMarks->pArray[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0);
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  return iVar3;
}

Assistant:

int Spl_ManCountMarkedFanins( Gia_Man_t * p, int iObj, Vec_Bit_t * vMarks )
{
    int i, iFan, Count = 0;
    Vec_Int_t * vFanins = Gia_ObjLutFanins2(p, iObj);
    Vec_IntForEachEntry( vFanins, iFan, i )
        if ( Vec_BitEntry(vMarks, iFan) )
            Count++;
    return Count;
}